

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMesh *pMesh)

{
  aiBone *pBone;
  bool bVar1;
  char *pcVar2;
  float *__p;
  type pfVar3;
  pointer afSum_00;
  reference rVar4;
  uint local_cc;
  char *pcStack_c8;
  uint i_7;
  char *name;
  uint a_1;
  aiBone *bone;
  uint i_6;
  uint i_5;
  unique_ptr<float[],_std::default_delete<float[]>_> afSum;
  uint i_4;
  uint i_3;
  _Bit_type local_90;
  uint local_88;
  byte local_81;
  uint i_2;
  bool b;
  _Bit_type local_78;
  uint local_6c;
  aiFace *paStack_68;
  uint a;
  aiFace *face_1;
  uint i_1;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> abRefList;
  aiFace *face;
  uint i;
  aiMesh *pMesh_local;
  ValidateDSProcess *this_local;
  
  if ((this->mScene->mNumMaterials != 0) && (this->mScene->mNumMaterials <= pMesh->mMaterialIndex))
  {
    ReportError(this,"aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)",
                (ulong)pMesh->mMaterialIndex,(ulong)(this->mScene->mNumMaterials - 1));
  }
  Validate(this,&pMesh->mName);
  for (face._4_4_ = 0; face._4_4_ < pMesh->mNumFaces; face._4_4_ = face._4_4_ + 1) {
    abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)(pMesh->mFaces + face._4_4_);
    if (pMesh->mPrimitiveTypes != 0) {
      switch(((aiFace *)
             abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage)->mNumIndices) {
      case 0:
        ReportError(this,"aiMesh::mFaces[%i].mNumIndices is 0",(ulong)face._4_4_);
      case 1:
        if ((pMesh->mPrimitiveTypes & 1) == 0) {
          ReportError(this,
                      "aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes does not report the POINT flag"
                      ,(ulong)face._4_4_);
        }
        break;
      case 2:
        if ((pMesh->mPrimitiveTypes & 2) == 0) {
          ReportError(this,
                      "aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes does not report the LINE flag"
                      ,(ulong)face._4_4_);
        }
        break;
      case 3:
        if ((pMesh->mPrimitiveTypes & 4) == 0) {
          ReportError(this,
                      "aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes does not report the TRIANGLE flag"
                      ,(ulong)face._4_4_);
        }
        break;
      default:
        if ((pMesh->mPrimitiveTypes & 8) == 0) {
          ReportError(this,
                      "aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes does not report the POLYGON flag"
                      ,(ulong)face._4_4_);
        }
      }
    }
    if (((aiFace *)
        abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage)->mIndices == (uint *)0x0) {
      ReportError(this,"aiMesh::mFaces[%i].mIndices is NULL",(ulong)face._4_4_);
    }
  }
  if ((pMesh->mNumVertices == 0) ||
     ((pMesh->mVertices == (aiVector3D *)0x0 && (this->mScene->mFlags == 0)))) {
    pcVar2 = aiString::C_Str(&pMesh->mName);
    ReportError(this,"The mesh %s contains no vertices",pcVar2);
  }
  if (0x7fffffff < pMesh->mNumVertices) {
    ReportError(this,"Mesh has too many vertices: %u, but the limit is %u",
                (ulong)pMesh->mNumVertices,0x7fffffff);
  }
  if (0x7fffffff < pMesh->mNumFaces) {
    ReportError(this,"Mesh has too many faces: %u, but the limit is %u",(ulong)pMesh->mNumFaces,
                0x7fffffff);
  }
  if ((pMesh->mTangents != (aiVector3D *)0x0) != (pMesh->mBitangents != (aiVector3D *)0x0)) {
    ReportError(this,"If there are tangents, bitangent vectors must be present as well");
  }
  if ((pMesh->mNumFaces == 0) || ((pMesh->mFaces == (aiFace *)0x0 && (this->mScene->mFlags == 0))))
  {
    pcVar2 = aiString::C_Str(&pMesh->mName);
    ReportError(this,"Mesh %s contains no faces",pcVar2);
  }
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_50);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)pMesh->mNumVertices,false);
  for (face_1._0_4_ = 0; (uint)face_1 < pMesh->mNumFaces; face_1._0_4_ = (uint)face_1 + 1) {
    paStack_68 = pMesh->mFaces + (uint)face_1;
    if (0x7fff < paStack_68->mNumIndices) {
      ReportError(this,"Face %u has too many faces: %u, but the limit is %u",(ulong)(uint)face_1,
                  (ulong)paStack_68->mNumIndices,0x7fff);
    }
    for (local_6c = 0; local_6c < paStack_68->mNumIndices; local_6c = local_6c + 1) {
      if (pMesh->mNumVertices <= paStack_68->mIndices[local_6c]) {
        ReportError(this,"aiMesh::mFaces[%i]::mIndices[%i] is out of range",(ulong)(uint)face_1,
                    (ulong)local_6c);
      }
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,
                         (ulong)paStack_68->mIndices[local_6c]);
      _i_2 = rVar4;
      std::_Bit_reference::operator=((_Bit_reference *)&i_2,true);
    }
  }
  local_81 = 0;
  for (local_88 = 0; local_88 < pMesh->mNumVertices; local_88 = local_88 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)local_88);
    _i_4 = rVar4;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&i_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_81 = 1;
    }
  }
  std::vector<bool,_std::allocator<bool>_>::clear((vector<bool,_std::allocator<bool>_> *)local_50);
  if ((local_81 & 1) != 0) {
    ReportWarning(this,"There are unreferenced vertices");
  }
  for (afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ = 0;
      afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ < 8;
      afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ =
           afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ + 1) {
    bVar1 = aiMesh::HasTextureCoords
                      (pMesh,afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_);
    if (!bVar1) break;
  }
  for (; afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ < 8;
      afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ =
           afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ + 1) {
    bVar1 = aiMesh::HasTextureCoords
                      (pMesh,afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_);
    if (bVar1) {
      ReportError(this,
                  "Texture coordinate channel %i exists although the previous channel was NULL.",
                  (ulong)afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                         .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                         super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_);
    }
  }
  for (afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ = 0;
      (uint)afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
            super__Head_base<0UL,_float_*,_false>._M_head_impl < 8;
      afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ =
           (uint)afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl + 1) {
    bVar1 = aiMesh::HasVertexColors
                      (pMesh,(uint)afSum._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl);
    if (!bVar1) break;
  }
  for (; (uint)afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl < 8;
      afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ =
           (uint)afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl + 1) {
    bVar1 = aiMesh::HasVertexColors
                      (pMesh,(uint)afSum._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl);
    if (bVar1) {
      ReportError(this,"Vertex color channel %i is exists although the previous channel was NULL.",
                  (ulong)(uint)afSum._M_t.
                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                               super__Head_base<0UL,_float_*,_false>._M_head_impl);
    }
  }
  if (pMesh->mNumBones == 0) {
    if (pMesh->mBones != (aiBone **)0x0) {
      ReportError(this,"aiMesh::mBones is non-null although there are no bones");
    }
  }
  else {
    if (pMesh->mBones == (aiBone **)0x0) {
      ReportError(this,"aiMesh::mBones is NULL (aiMesh::mNumBones is %i)",(ulong)pMesh->mNumBones);
    }
    std::unique_ptr<float[],std::default_delete<float[]>>::
    unique_ptr<std::default_delete<float[]>,void>
              ((unique_ptr<float[],std::default_delete<float[]>> *)&i_6,(nullptr_t)0x0);
    if (pMesh->mNumVertices != 0) {
      __p = (float *)operator_new__((ulong)pMesh->mNumVertices << 2);
      std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&i_6,__p);
      for (bone._4_4_ = 0; bone._4_4_ < pMesh->mNumVertices; bone._4_4_ = bone._4_4_ + 1) {
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6,
                            (ulong)bone._4_4_);
        *pfVar3 = 0.0;
      }
    }
    for (bone._0_4_ = 0; (uint)bone < pMesh->mNumBones; bone._0_4_ = (uint)bone + 1) {
      if (0x7fffffff < pMesh->mBones[(uint)bone]->mNumWeights) {
        ReportError(this,"Bone %u has too many weights: %u, but the limit is %u",(ulong)(uint)bone,
                    (ulong)pMesh->mBones[(uint)bone]->mNumWeights,0x7fffffff);
      }
      if (pMesh->mBones[(uint)bone] == (aiBone *)0x0) {
        ReportError(this,"aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",(ulong)(uint)bone,
                    (ulong)pMesh->mNumBones);
      }
      pBone = pMesh->mBones[(uint)bone];
      afSum_00 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6);
      Validate(this,pMesh,pBone,afSum_00);
      name._4_4_ = (uint)bone;
      while (name._4_4_ = name._4_4_ + 1, name._4_4_ < pMesh->mNumBones) {
        bVar1 = aiString::operator==
                          (&pMesh->mBones[(uint)bone]->mName,&pMesh->mBones[name._4_4_]->mName);
        if (bVar1) {
          pcStack_c8 = "unknown";
          pcVar2 = aiString::C_Str(&pMesh->mBones[(uint)bone]->mName);
          if (pcVar2 != (char *)0x0) {
            pcStack_c8 = aiString::C_Str(&pMesh->mBones[(uint)bone]->mName);
          }
          ReportError(this,
                      "aiMesh::mBones[%i], name = \"%s\" has the same name as aiMesh::mBones[%i]",
                      (ulong)(uint)bone,pcStack_c8,(ulong)name._4_4_);
        }
      }
    }
    for (local_cc = 0; local_cc < pMesh->mNumVertices; local_cc = local_cc + 1) {
      pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6,(ulong)local_cc
                         );
      if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6,
                            (ulong)local_cc);
        if (0.94 < *pfVar3) {
          pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                             ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6,
                              (ulong)local_cc);
          if (*pfVar3 < 1.05) goto LAB_0043d000;
        }
        pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6,
                            (ulong)local_cc);
        ReportWarning(this,"aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",
                      (double)*pfVar3,(ulong)local_cc);
      }
LAB_0043d000:
    }
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&i_6);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh)
{
    // validate the material index of the mesh
    if (mScene->mNumMaterials && pMesh->mMaterialIndex >= mScene->mNumMaterials)
    {
        ReportError("aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)",
            pMesh->mMaterialIndex,mScene->mNumMaterials-1);
    }

    Validate(&pMesh->mName);

    for (unsigned int i = 0; i < pMesh->mNumFaces; ++i)
    {
        aiFace& face = pMesh->mFaces[i];

        if (pMesh->mPrimitiveTypes)
        {
            switch (face.mNumIndices)
            {
            case 0:
                ReportError("aiMesh::mFaces[%i].mNumIndices is 0",i);
                break;
            case 1:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POINT))
                {
                    ReportError("aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes "
                        "does not report the POINT flag",i);
                }
                break;
            case 2:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_LINE))
                {
                    ReportError("aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes "
                        "does not report the LINE flag",i);
                }
                break;
            case 3:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE))
                {
                    ReportError("aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes "
                        "does not report the TRIANGLE flag",i);
                }
                break;
            default:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON))
                {
                    this->ReportError("aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes "
                        "does not report the POLYGON flag",i);
                }
                break;
            };
        }

        if (!face.mIndices)
            ReportError("aiMesh::mFaces[%i].mIndices is NULL",i);
    }

    // positions must always be there ...
    if (!pMesh->mNumVertices || (!pMesh->mVertices && !mScene->mFlags)) {
        ReportError("The mesh %s contains no vertices", pMesh->mName.C_Str());
    }

    if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        ReportError("Mesh has too many vertices: %u, but the limit is %u",pMesh->mNumVertices,AI_MAX_VERTICES);
    }
    if (pMesh->mNumFaces > AI_MAX_FACES) {
        ReportError("Mesh has too many faces: %u, but the limit is %u",pMesh->mNumFaces,AI_MAX_FACES);
    }

    // if tangents are there there must also be bitangent vectors ...
    if ((pMesh->mTangents != NULL) != (pMesh->mBitangents != NULL)) {
        ReportError("If there are tangents, bitangent vectors must be present as well");
    }

    // faces, too
    if (!pMesh->mNumFaces || (!pMesh->mFaces && !mScene->mFlags))   {
        ReportError("Mesh %s contains no faces", pMesh->mName.C_Str());
    }

    // now check whether the face indexing layout is correct:
    // unique vertices, pseudo-indexed.
    std::vector<bool> abRefList;
    abRefList.resize(pMesh->mNumVertices,false);
    for (unsigned int i = 0; i < pMesh->mNumFaces;++i)
    {
        aiFace& face = pMesh->mFaces[i];
        if (face.mNumIndices > AI_MAX_FACE_INDICES) {
            ReportError("Face %u has too many faces: %u, but the limit is %u",i,face.mNumIndices,AI_MAX_FACE_INDICES);
        }

        for (unsigned int a = 0; a < face.mNumIndices;++a)
        {
            if (face.mIndices[a] >= pMesh->mNumVertices)    {
                ReportError("aiMesh::mFaces[%i]::mIndices[%i] is out of range",i,a);
            }
            // the MSB flag is temporarily used by the extra verbose
            // mode to tell us that the JoinVerticesProcess might have
            // been executed already.
			/*if ( !(this->mScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT ) && !(this->mScene->mFlags & AI_SCENE_FLAGS_ALLOW_SHARED) &&
				abRefList[face.mIndices[a]])
            {
                ReportError("aiMesh::mVertices[%i] is referenced twice - second "
                    "time by aiMesh::mFaces[%i]::mIndices[%i]",face.mIndices[a],i,a);
            }*/
            abRefList[face.mIndices[a]] = true;
        }
    }

    // check whether there are vertices that aren't referenced by a face
    bool b = false;
    for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
        if (!abRefList[i])b = true;
    }
    abRefList.clear();
    if (b) {
    	ReportWarning("There are unreferenced vertices");
    }

    // texture channel 2 may not be set if channel 1 is zero ...
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
        {
            if (!pMesh->HasTextureCoords(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            if (pMesh->HasTextureCoords(i))
            {
                ReportError("Texture coordinate channel %i exists "
                    "although the previous channel was NULL.",i);
            }
    }
    // the same for the vertex colors
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
        {
            if (!pMesh->HasVertexColors(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
            if (pMesh->HasVertexColors(i))
            {
                ReportError("Vertex color channel %i is exists "
                    "although the previous channel was NULL.",i);
            }
    }


    // now validate all bones
    if (pMesh->mNumBones)
    {
        if (!pMesh->mBones)
        {
            ReportError("aiMesh::mBones is NULL (aiMesh::mNumBones is %i)",
                pMesh->mNumBones);
        }
        std::unique_ptr<float[]> afSum(nullptr);
        if (pMesh->mNumVertices)
        {
            afSum.reset(new float[pMesh->mNumVertices]);
            for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
                afSum[i] = 0.0f;
        }

        // check whether there are duplicate bone names
        for (unsigned int i = 0; i < pMesh->mNumBones;++i)
        {
            const aiBone* bone = pMesh->mBones[i];
            if (bone->mNumWeights > AI_MAX_BONE_WEIGHTS) {
                ReportError("Bone %u has too many weights: %u, but the limit is %u",i,bone->mNumWeights,AI_MAX_BONE_WEIGHTS);
            }

            if (!pMesh->mBones[i])
            {
                ReportError("aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",
                    i,pMesh->mNumBones);
            }
            Validate(pMesh,pMesh->mBones[i],afSum.get());

            for (unsigned int a = i+1; a < pMesh->mNumBones;++a)
            {
                if (pMesh->mBones[i]->mName == pMesh->mBones[a]->mName)
                {
                    const char *name = "unknown";
                    if (nullptr != pMesh->mBones[ i ]->mName.C_Str()) {
                        name = pMesh->mBones[ i ]->mName.C_Str();
                    }
                    ReportError("aiMesh::mBones[%i], name = \"%s\" has the same name as "
                        "aiMesh::mBones[%i]", i, name, a );
                }
            }
        }
        // check whether all bone weights for a vertex sum to 1.0 ...
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
        {
            if (afSum[i] && (afSum[i] <= 0.94 || afSum[i] >= 1.05)) {
                ReportWarning("aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",i,afSum[i]);
            }
        }
    }
    else if (pMesh->mBones)
    {
        ReportError("aiMesh::mBones is non-null although there are no bones");
    }
}